

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadControllerLibrary(ColladaParser *this)

{
  pointer puVar1;
  pointer ppVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar6;
  undefined4 extraout_var_01;
  string id;
  key_type local_1e8;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  undefined1 local_1b8 [24];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  ai_real local_180 [2];
  ai_real aaStack_178 [2];
  ai_real local_170 [2];
  ai_real aaStack_168 [2];
  ai_real local_160 [2];
  ai_real aaStack_158 [2];
  ai_real local_150 [2];
  ai_real aaStack_148 [2];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  InputType local_120;
  undefined4 uStack_11c;
  size_t sStack_118;
  size_t sStack_110;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Accessor *local_e8;
  InputType local_e0;
  undefined4 uStack_dc;
  size_t sStack_d8;
  size_t sStack_d0;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Accessor *local_a8;
  pointer puStack_a0;
  pointer local_98;
  pointer puStack_90;
  pointer local_88;
  pointer ppStack_80;
  pointer local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar3 != '\0')) {
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        if (iVar4 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"controller");
        if (iVar3 == 0) {
          uVar5 = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
          std::__cxx11::string::string
                    ((string *)&local_1e8,(char *)CONCAT44(extraout_var_00,iVar3),
                     (allocator *)local_1c8);
          memset((Controller *)local_1c8,0,0x198);
          local_1c0._M_p = local_1b8 + 8;
          local_1b8._0_8_ = 0;
          local_1b8[8] = '\0';
          local_1a0._M_p = (pointer)&local_190;
          local_198 = 0;
          local_190._M_local_buf[0] = '\0';
          local_140._M_p = (pointer)&local_130;
          local_138 = 0;
          local_130._M_local_buf[0] = '\0';
          local_108._M_p = (pointer)&local_f8;
          local_100 = 0;
          local_f8._M_local_buf[0] = '\0';
          local_120 = IT_Invalid;
          local_e8 = (Accessor *)0x0;
          sStack_118 = 0;
          sStack_110 = 0;
          local_c8._M_p = (pointer)&local_b8;
          local_c0 = 0;
          local_b8._M_local_buf[0] = '\0';
          local_e0 = IT_Invalid;
          sStack_d8 = 0;
          sStack_d0 = 0;
          local_78 = (pointer)0x0;
          local_88 = (pointer)0x0;
          ppStack_80 = (pointer)0x0;
          local_98 = (pointer)0x0;
          puStack_90 = (pointer)0x0;
          local_a8 = (Accessor *)0x0;
          puStack_a0 = (pointer)0x0;
          local_70._M_p = (pointer)&local_60;
          local_68 = 0;
          local_60._M_local_buf[0] = '\0';
          local_50._M_p = (pointer)&local_40;
          local_48 = 0;
          local_40._M_local_buf[0] = '\0';
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                   ::operator[](&this->mControllerLibrary,&local_1e8);
          pmVar6->mType = local_1c8._0_4_;
          pmVar6->mMethod = local_1c8._4_4_;
          std::__cxx11::string::operator=((string *)&pmVar6->mMeshId,(string *)&local_1c0);
          std::__cxx11::string::operator=((string *)&pmVar6->mJointNameSource,(string *)&local_1a0);
          *(ai_real (*) [2])pmVar6->mBindShapeMatrix = local_180;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 2) = aaStack_178;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 4) = local_170;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 6) = aaStack_168;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 8) = local_160;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 10) = aaStack_158;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 0xc) = local_150;
          *(ai_real (*) [2])(pmVar6->mBindShapeMatrix + 0xe) = aaStack_148;
          std::__cxx11::string::operator=
                    ((string *)&pmVar6->mJointOffsetMatrixSource,(string *)&local_140);
          *(ulong *)&pmVar6->mWeightInputJoints = CONCAT44(uStack_11c,local_120);
          (pmVar6->mWeightInputJoints).mIndex = sStack_118;
          (pmVar6->mWeightInputJoints).mOffset = sStack_110;
          std::__cxx11::string::operator=
                    ((string *)&(pmVar6->mWeightInputJoints).mAccessor,(string *)&local_108);
          (pmVar6->mWeightInputJoints).mResolved = local_e8;
          (pmVar6->mWeightInputWeights).mOffset = sStack_d0;
          *(ulong *)&pmVar6->mWeightInputWeights = CONCAT44(uStack_dc,local_e0);
          (pmVar6->mWeightInputWeights).mIndex = sStack_d8;
          std::__cxx11::string::operator=
                    ((string *)&(pmVar6->mWeightInputWeights).mAccessor,(string *)&local_c8);
          (pmVar6->mWeightInputWeights).mResolved = local_a8;
          puVar1 = (pmVar6->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (pmVar6->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = puStack_a0;
          (pmVar6->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = local_98;
          (pmVar6->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_90;
          puStack_a0 = (pointer)0x0;
          local_98 = (pointer)0x0;
          puStack_90 = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          ppVar2 = (pmVar6->mWeights).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (pmVar6->mWeights).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_88;
          (pmVar6->mWeights).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppStack_80;
          (pmVar6->mWeights).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
          local_88 = (pointer)0x0;
          ppStack_80 = (pointer)0x0;
          local_78 = (pointer)0x0;
          if (ppVar2 != (pointer)0x0) {
            operator_delete(ppVar2);
          }
          std::__cxx11::string::operator=((string *)&pmVar6->mMorphTarget,(string *)&local_70);
          std::__cxx11::string::operator=((string *)&pmVar6->mMorphWeight,(string *)&local_50);
          Collada::Controller::~Controller((Controller *)local_1c8);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                   ::operator[](&this->mControllerLibrary,&local_1e8);
          ReadController(this,pmVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar4 == 2) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"library_controllers");
        if (iVar3 == 0) {
          return;
        }
        local_1c8 = (undefined1  [8])local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Expected end of <library_controllers> element.","");
        ThrowException(this,(string *)local_1c8);
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar3 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("controller"))
            {
                // read ID. Ask the spec if it's necessary or optional... you might be surprised.
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mControllerLibrary[id] = Controller();

                // read on from there
                ReadController(mControllerLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_controllers") != 0)
                ThrowException("Expected end of <library_controllers> element.");

            break;
        }
    }
}